

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyXValuesAreSorted.hpp
# Opt level: O1

void njoy::ENDFtk::TabulationRecord::verifyXValuesAreSorted
               (vector<double,_std::allocator<double>_> *xValues)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  undefined8 *puVar4;
  long args_1;
  double *pdVar5;
  
  pdVar2 = (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar5 = pdVar3;
  if (pdVar2 != pdVar3) {
    do {
      pdVar5 = pdVar2 + 1;
      if (pdVar5 == pdVar3) break;
      dVar1 = *pdVar2;
      pdVar2 = pdVar5;
    } while (dVar1 < *pdVar5 || dVar1 == *pdVar5);
  }
  if (pdVar5 != pdVar3) {
    tools::Log::error<char_const*>("X-values are not sorted");
    args_1 = (long)pdVar5 -
             (long)(xValues->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    tools::Log::info<char_const*,long,double>("X-value [{}]: {}",args_1 + -1,pdVar5[-1]);
    tools::Log::info<char_const*,long,double>("X-value [{}]: {}",args_1,*pdVar5);
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = getenv;
    __cxa_throw(puVar4,&std::exception::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

static void
verifyXValuesAreSorted( const std::vector< double >& xValues ){
  auto xValuesIterator = std::is_sorted_until( xValues.begin(), xValues.end() );
  const bool xValuesAreSorted = ( xValuesIterator == xValues.end() );
    
  if ( not xValuesAreSorted ){
    Log::error( "X-values are not sorted" );
    const auto position = xValuesIterator - xValues.begin();
    Log::info( "X-value [{}]: {}", (position - 1), xValuesIterator[-1] );
    Log::info( "X-value [{}]: {}", position, xValuesIterator[0] );
    throw std::exception();
  }
}